

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YP_md_get_parameter_array(YPSpur *spur,int param_id,double *value)

{
  int iVar1;
  undefined1 auStack_60 [4];
  int len;
  YPSpur_msg msg;
  double *value_local;
  int param_id_local;
  YPSpur *spur_local;
  
  _auStack_60 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x101;
  msg.pid._4_4_ = param_id;
  msg.data[3] = (double)value;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_60);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)auStack_60);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local._4_4_ = -1;
    }
    else {
      *(undefined8 *)msg.data[3] = msg._16_8_;
      *(double *)((long)msg.data[3] + 8) = msg.data[0];
      spur_local._4_4_ = msg.pid._4_4_;
    }
  }
  return spur_local._4_4_;
}

Assistant:

int YP_md_get_parameter_array(YPSpur* spur, int param_id, double* value)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_PARAM_GET;
  msg.cs = param_id;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  value[0] = msg.data[0];
  value[1] = msg.data[1];
  return msg.cs;
}